

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

bool __thiscall
yactfr::internal::Vm::_newDataBlock(Vm *this,Index offsetInElemSeqBytes,Size sizeBytes)

{
  optional<yactfr::DataBlock> dataBlock;
  optional<yactfr::DataBlock> local_30;
  
  if (sizeBytes < 10) {
    DataSource::data(&local_30,
                     (this->_dataSrc)._M_t.
                     super___uniq_ptr_impl<yactfr::DataSource,_std::default_delete<yactfr::DataSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_yactfr::DataSource_*,_std::default_delete<yactfr::DataSource>_>
                     .super__Head_base<0UL,_yactfr::DataSource_*,_false>._M_head_impl,
                     offsetInElemSeqBytes,sizeBytes);
    if (local_30.super_type.m_initialized == true) {
      this->_bufAddr = (uint8_t *)local_30.super_type.m_storage.dummy_.aligner_;
      this->_bufLenBits = local_30.super_type.m_storage.dummy_._8_8_ << 3;
      this->_bufOffsetInCurPktBits =
           offsetInElemSeqBytes * 8 - (this->_pos).curPktOffsetInElemSeqBits;
    }
    return local_30.super_type.m_initialized;
  }
  __assert_fail("sizeBytes <= 9",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/vm.cpp"
                ,0x172,"bool yactfr::internal::Vm::_newDataBlock(const Index, const Size)");
}

Assistant:

bool Vm::_newDataBlock(const Index offsetInElemSeqBytes, const Size sizeBytes)
{
    assert(sizeBytes <= 9);

    const auto dataBlock = _dataSrc->data(offsetInElemSeqBytes, sizeBytes);

    if (!dataBlock) {
        // no data
        return false;
    }

    _bufAddr = static_cast<const std::uint8_t *>(dataBlock->address());
    _bufLenBits = dataBlock->size() * 8;
    _bufOffsetInCurPktBits = offsetInElemSeqBytes * 8 - _pos.curPktOffsetInElemSeqBits;
    return true;
}